

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

Value * __thiscall Json::Value::operator[](Value *this,ArrayIndex index)

{
  bool bVar1;
  iterator this_00;
  reference ppVar2;
  ArrayIndex in_ESI;
  string *in_RDI;
  const_iterator it;
  CZString key;
  ostringstream oss;
  CZString *this_01;
  iterator local_1f0;
  _Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> local_1e8;
  iterator local_1e0;
  _Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> local_1d8;
  CZString local_1d0;
  string local_1c0 [48];
  ostringstream local_190 [392];
  Value *local_8;
  
  if (((in_RDI->_M_string_length & 0xff) != 0) && ((in_RDI->_M_string_length & 0xff) != 6)) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::operator<<((ostream *)local_190,
                    "in Json::Value::operator[](ArrayIndex)const: requires arrayValue");
    std::__cxx11::ostringstream::str();
    throwLogicError(in_RDI);
    std::__cxx11::string::~string(local_1c0);
    abort();
  }
  if ((in_RDI->_M_string_length & 0xff) == 0) {
    local_8 = (Value *)kNull;
  }
  else {
    this_01 = &local_1d0;
    CZString::CZString(this_01,in_ESI);
    this_00 = std::
              map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
              ::find((map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                      *)this_01,(key_type *)0x126c63);
    local_1e0._M_node = this_00._M_node;
    std::_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
    _Rb_tree_const_iterator(&local_1d8,&local_1e0);
    local_1f0._M_node =
         (_Base_ptr)
         std::
         map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
         ::end((map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                *)this_01);
    std::_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
    _Rb_tree_const_iterator(&local_1e8,&local_1f0);
    bVar1 = std::operator==(&local_1d8,&local_1e8);
    if (bVar1) {
      local_8 = (Value *)kNull;
    }
    else {
      ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
               operator*((_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>
                          *)this_00._M_node);
      local_8 = &ppVar2->second;
    }
    CZString::~CZString((CZString *)this_00._M_node);
  }
  return local_8;
}

Assistant:

const Value& Value::operator[](ArrayIndex index) const {
  JSON_ASSERT_MESSAGE(
      type_ == nullValue || type_ == arrayValue,
      "in Json::Value::operator[](ArrayIndex)const: requires arrayValue");
  if (type_ == nullValue)
    return nullRef;
  CZString key(index);
  ObjectValues::const_iterator it = value_.map_->find(key);
  if (it == value_.map_->end())
    return nullRef;
  return (*it).second;
}